

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O2

REF_STATUS ref_adapt_tattle_faces(REF_GRID ref_grid)

{
  REF_INT node;
  int node1;
  REF_DBL *pRVar1;
  REF_MPI pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  REF_MPI ref_mpi;
  long lVar10;
  char *pcVar11;
  REF_CELL ref_cell;
  double dVar12;
  REF_DBL min_quality;
  uint local_170;
  REF_BOOL has_side;
  REF_DBL min_angle;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL ratio;
  REF_DBL min_normdev;
  REF_GRID local_140;
  REF_DBL quality;
  REF_MPI local_130;
  REF_DBL normdev;
  int local_120;
  REF_INT max_id;
  REF_INT min_id;
  REF_BOOL geom_node;
  REF_DBL angle;
  double local_108;
  REF_NODE local_100;
  REF_DBL local_f8;
  REF_GEOM local_f0;
  double local_e8 [4];
  REF_DBL dx1 [3];
  int iStack_ac;
  REF_INT nodes [27];
  
  ref_mpi = ref_grid->mpi;
  ref_cell = ref_grid->cell[3];
  uVar3 = ref_cell_id_range(ref_cell,ref_mpi,&min_id,&max_id);
  uVar5 = min_id;
  pRVar2 = ref_mpi;
  if (uVar3 == 0) {
    while (local_130 = pRVar2, (int)uVar5 <= max_id) {
      min_quality = 1.0;
      for (iVar9 = 0; iVar9 < ref_cell->max; iVar9 = iVar9 + 1) {
        RVar4 = ref_cell_nodes(ref_cell,iVar9,nodes);
        if ((RVar4 == 0) && (uVar5 == nodes[ref_cell->node_per])) {
          uVar3 = ref_node_tri_quality(ref_grid->node,nodes,&quality);
          if (uVar3 != 0) {
            pcVar11 = "qual";
            uVar8 = 0x21c;
            goto LAB_001253e5;
          }
          ref_mpi = local_130;
          if (quality <= min_quality) {
            min_quality = quality;
          }
        }
      }
      quality = min_quality;
      local_140 = ref_grid;
      uVar3 = ref_mpi_min(ref_mpi,&quality,&min_quality,3);
      if (uVar3 != 0) {
        pcVar11 = "min";
        uVar8 = 0x220;
        goto LAB_001253b5;
      }
      uVar3 = ref_mpi_bcast(ref_mpi,&quality,1,3);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x221,"ref_adapt_tattle_faces",(ulong)uVar3,"min");
        return uVar3;
      }
      min_normdev = 2.0;
      min_angle = 90.0;
      ref_grid = local_140;
      local_170 = uVar5;
      if ((local_140->geom->model != (void *)0x0) || (local_140->geom->meshlink != (void *)0x0)) {
        ref_cell = local_140->cell[3];
        for (iVar9 = 0; iVar9 < ref_cell->max; iVar9 = iVar9 + 1) {
          RVar4 = ref_cell_nodes(ref_cell,iVar9,nodes);
          if ((RVar4 == 0) && (uVar5 == nodes[ref_cell->node_per])) {
            uVar3 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev);
            if (uVar3 == 0) {
              if (normdev <= min_normdev) {
                min_normdev = normdev;
              }
              local_100 = ref_grid->node;
              local_f0 = ref_grid->geom;
              lVar7 = 0;
              local_120 = iVar9;
LAB_00124ede:
              lVar10 = lVar7;
              ref_mpi = local_130;
              ref_grid = local_140;
              uVar5 = local_170;
              iVar9 = local_120;
              if (lVar10 != 3) {
                node = nodes[lVar10];
                uVar3 = ref_geom_is_a(local_f0,node,0,&geom_node);
                if (uVar3 == 0) goto code_r0x00124f11;
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x1eb,"ref_adapt_min_sliver_angle",(ulong)uVar3,"geom node check");
                goto LAB_001254a2;
              }
              goto LAB_001250e5;
            }
            pcVar11 = "norm dev";
            uVar8 = 0x22a;
            goto LAB_001253b5;
          }
LAB_001250e5:
        }
      }
      normdev = min_normdev;
      uVar3 = ref_mpi_min(ref_mpi,&normdev,&min_normdev,3);
      if (uVar3 != 0) {
        uVar8 = 0x231;
LAB_001255d5:
        pcVar11 = "mpi max";
LAB_001253b5:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               uVar8,"ref_adapt_tattle_faces",(ulong)uVar3,pcVar11);
        return uVar3;
      }
      uVar3 = ref_mpi_bcast(ref_mpi,&min_normdev,1,3);
      if (uVar3 != 0) {
        pcVar11 = "min";
        uVar8 = 0x232;
LAB_001253e5:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               uVar8,"ref_adapt_tattle_faces",(ulong)uVar3,pcVar11);
        return uVar3;
      }
      angle = min_angle;
      uVar3 = ref_mpi_min(ref_mpi,&angle,&min_angle,3);
      if (uVar3 != 0) {
        uVar8 = 0x234;
        goto LAB_001255d5;
      }
      uVar3 = ref_mpi_bcast(ref_mpi,&min_angle,1,3);
      if (uVar3 != 0) {
        pcVar11 = "min";
        uVar8 = 0x235;
        goto LAB_001253b5;
      }
      min_ratio = 1e+200;
      max_ratio = -1e+200;
      for (iVar9 = 0; ref_mpi = local_130, iVar9 < ref_cell->max; iVar9 = iVar9 + 1) {
        RVar4 = ref_cell_nodes(ref_cell,iVar9,nodes);
        if ((RVar4 == 0) && (local_170 == nodes[ref_cell->node_per])) {
          lVar7 = 0;
          while (lVar7 != 3) {
            lVar10 = lVar7 + 1;
            lVar6 = 0;
            if (lVar7 != 2) {
              lVar6 = lVar10;
            }
            uVar3 = ref_node_ratio(ref_grid->node,nodes[lVar7],nodes[lVar6],&ratio);
            if (uVar3 != 0) {
              pcVar11 = "rat";
              uVar8 = 0x241;
              goto LAB_001253b5;
            }
            if (ratio <= min_ratio) {
              min_ratio = ratio;
            }
            lVar7 = lVar10;
            if (max_ratio <= ratio) {
              max_ratio = ratio;
            }
          }
          if (quality <= min_quality) {
            min_quality = quality;
          }
        }
      }
      ratio = min_ratio;
      uVar5 = ref_mpi_min(local_130,&ratio,&min_ratio,3);
      if (uVar5 != 0) {
        pcVar11 = "mpi min";
        uVar8 = 0x248;
LAB_00125699:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               uVar8,"ref_adapt_tattle_faces",(ulong)uVar5,pcVar11);
        return uVar5;
      }
      uVar5 = ref_mpi_bcast(ref_mpi,&min_ratio,1,3);
      if (uVar5 != 0) {
        pcVar11 = "min";
        uVar8 = 0x249;
        goto LAB_00125699;
      }
      ratio = max_ratio;
      uVar5 = ref_mpi_max(ref_mpi,&ratio,&max_ratio,3);
      if (uVar5 != 0) {
        pcVar11 = "mpi max";
        uVar8 = 0x24b;
        goto LAB_00125699;
      }
      uVar5 = ref_mpi_bcast(ref_mpi,&max_ratio,1,3);
      uVar3 = local_170;
      if (uVar5 != 0) {
        pcVar11 = "max";
        uVar8 = 0x24c;
        goto LAB_00125699;
      }
      if ((ref_mpi->id == 0) &&
         ((((min_quality < 0.1 || (min_ratio < 0.1)) || (4.0 < max_ratio)) || (min_normdev < 0.5))))
      {
        printf("face%6d quality %6.4f ratio %6.4f %6.2f normdev %6.4f topo angle %5.2f\n",
               (ulong)local_170);
      }
      pRVar2 = local_130;
      uVar5 = uVar3 + 1;
    }
    uVar3 = 0;
  }
  else {
    pcVar11 = "id range";
    uVar8 = 0x216;
LAB_001254c3:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar8,
           "ref_adapt_tattle_faces",(ulong)uVar3,pcVar11);
  }
  return uVar3;
code_r0x00124f11:
  lVar7 = lVar10 + 1;
  if (geom_node == 0) goto LAB_00124ede;
  lVar6 = lVar7;
  if (lVar10 == 2) {
    lVar6 = 0;
  }
  iVar9 = nodes[lVar6];
  lVar6 = (long)((int)lVar10 + -1);
  if (lVar10 == 0) {
    lVar6 = 2;
  }
  node1 = nodes[lVar6];
  uVar3 = ref_cell_has_side(local_140->cell[0],node,iVar9,&has_side);
  if (uVar3 == 0) {
    if (has_side == 0) goto LAB_00124ede;
    uVar3 = ref_cell_has_side(local_140->cell[0],node,node1,&has_side);
    if (uVar3 == 0) {
      if (has_side == 0) goto LAB_00124ede;
      pRVar1 = local_100->real;
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        dx1[lVar10] = pRVar1[iVar9 * 0xf + lVar10] - pRVar1[node * 0xf + lVar10];
        local_e8[lVar10] = pRVar1[node1 * 0xf + lVar10] - pRVar1[node * 0xf + lVar10];
      }
      uVar3 = ref_math_normalize(dx1);
      if (uVar3 == 0) {
        uVar3 = ref_math_normalize(local_e8);
        if (uVar3 == 0) {
          local_108 = dx1[2] * local_e8[2] + dx1[0] * local_e8[0] + dx1[1] * local_e8[1];
          local_f8 = min_angle;
          dVar12 = acos(local_108);
          if ((dVar12 * 180.0) / 3.14159265358979 <= local_f8) {
            dVar12 = acos(local_108);
            min_angle = (dVar12 * 180.0) / 3.14159265358979;
          }
          goto LAB_00124ede;
        }
        pcVar11 = "dx2";
        uVar8 = 0x200;
      }
      else {
        pcVar11 = "dx1";
        uVar8 = 0x1ff;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar8
             ,"ref_adapt_min_sliver_angle",(ulong)uVar3,pcVar11);
      goto LAB_001254a2;
    }
    pcVar11 = "has edge node-node2";
    uVar8 = 0x1f7;
  }
  else {
    pcVar11 = "has edge node-node1";
    uVar8 = 500;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar8,
         "ref_adapt_min_sliver_angle",(ulong)uVar3,pcVar11);
LAB_001254a2:
  pcVar11 = "sliver angle";
  uVar8 = 0x22d;
  goto LAB_001254c3;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_tattle_faces(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_DBL ratio, min_ratio, max_ratio;
  REF_DBL angle, min_angle;
  REF_INT edge, n0, n1;
  REF_INT id, min_id, max_id;

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_id_range(ref_cell, ref_mpi, &min_id, &max_id), "id range");
  for (id = min_id; id <= max_id; id++) {
    min_quality = 1.0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      min_quality = MIN(min_quality, quality);
    }
    quality = min_quality;
    RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "min");
    RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "min");

    min_normdev = 2.0;
    min_angle = 90.0;
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
        ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
      ref_cell = ref_grid_tri(ref_grid);
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
        RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
        min_normdev = MIN(min_normdev, normdev);
        RSS(ref_adapt_min_sliver_angle(ref_grid, nodes, &min_angle),
            "sliver angle");
      }
    }
    normdev = min_normdev;
    RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");
    angle = min_angle;
    RSS(ref_mpi_min(ref_mpi, &angle, &min_angle, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_angle, 1, REF_DBL_TYPE), "min");

    min_ratio = REF_DBL_MAX;
    max_ratio = REF_DBL_MIN;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      for (edge = 0; edge < 3; edge++) {
        n0 = edge;
        n1 = edge + 1;
        if (n1 > 2) n1 -= 3;
        RSS(ref_node_ratio(ref_grid_node(ref_grid), nodes[n0], nodes[n1],
                           &ratio),
            "rat");
        min_ratio = MIN(min_ratio, ratio);
        max_ratio = MAX(max_ratio, ratio);
      }
      min_quality = MIN(min_quality, quality);
    }
    ratio = min_ratio;
    RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
    RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
    ratio = max_ratio;
    RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

    if (ref_mpi_once(ref_mpi)) {
      if (min_quality < 0.1 || min_ratio < 0.1 || max_ratio > 4.0 ||
          min_normdev < 0.5) {
        printf(
            "face%6d quality %6.4f ratio %6.4f %6.2f normdev %6.4f"
            " topo angle %5.2f\n",
            id, min_quality, min_ratio, max_ratio, min_normdev, angle);
      }
    }
  }

  return REF_SUCCESS;
}